

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O0

void Js::RegexHelper::
     ReplaceFormatString<Js::RegexHelper::RegexEs5ReplaceImpl(Js::ScriptContext*,Js::JavascriptRegExp*,Js::JavascriptString*,Js::JavascriptString*,bool)::__0>
               (ScriptContext *scriptContext,int numGroups,anon_class_24_3_dc2687f5 getGroup,
               JavascriptString *input,char16 *matchedString,GroupInfo match,
               JavascriptString *replace,int substitutions,CharCount *substitutionOffsets,
               Builder<256U> *concatenated)

{
  char16 cVar1;
  CharCount startIndex;
  code *pcVar2;
  bool bVar3;
  ushort uVar4;
  charcount_t cVar5;
  charcount_t cVar6;
  CharCount CVar7;
  CharCount CVar8;
  Var nonMatchValue_00;
  char16 *pcVar9;
  undefined4 *puVar10;
  Var aValue;
  JavascriptString *s;
  Var group;
  uint16 tempCaptureIndex;
  uint16 captureIndex;
  char16 currentChar;
  CharCount substitutionOffset;
  int i;
  CharCount offset;
  CharCount replaceLength;
  char16 *replaceStr;
  CharCount inputLength;
  Var nonMatchValue;
  JavascriptString *replace_local;
  char16 *matchedString_local;
  JavascriptString *input_local;
  int numGroups_local;
  ScriptContext *scriptContext_local;
  GroupInfo match_local;
  
  scriptContext_local = (ScriptContext *)match;
  nonMatchValue_00 = NonMatchValue(scriptContext,false);
  cVar5 = JavascriptString::GetLength(input);
  pcVar9 = JavascriptString::GetString(replace);
  cVar6 = JavascriptString::GetLength(replace);
  substitutionOffset = 0;
  _captureIndex = 0;
  do {
    if (substitutions <= _captureIndex) {
      CompoundString::Builder<256U>::Append
                (concatenated,replace,substitutionOffset,cVar6 - substitutionOffset);
      return;
    }
    startIndex = substitutionOffsets[_captureIndex];
    CompoundString::Builder<256U>::Append
              (concatenated,replace,substitutionOffset,startIndex - substitutionOffset);
    cVar1 = pcVar9[startIndex + 1];
    if (((ushort)cVar1 < 0x30) || (0x39 < (ushort)cVar1)) {
      if (cVar1 == L'$') {
        CompoundString::Builder<256U>::Append(concatenated,L'$');
        substitutionOffset = startIndex + 2;
      }
      else if (cVar1 == L'&') {
        CompoundString::Builder<256U>::Append(concatenated,matchedString,scriptContext_local._4_4_);
        substitutionOffset = startIndex + 2;
      }
      else if (cVar1 == L'\'') {
        CVar7 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)&scriptContext_local);
        if (CVar7 < cVar5) {
          CVar7 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)&scriptContext_local);
          CVar8 = UnifiedRegex::GroupInfo::EndOffset((GroupInfo *)&scriptContext_local);
          CompoundString::Builder<256U>::Append(concatenated,input,CVar7,cVar5 - CVar8);
        }
        substitutionOffset = startIndex + 2;
      }
      else if (cVar1 == L'`') {
        CompoundString::Builder<256U>::Append(concatenated,input,0,(CharCount)scriptContext_local);
        substitutionOffset = startIndex + 2;
      }
      else {
        CompoundString::Builder<256U>::Append(concatenated,L'$');
        substitutionOffset = startIndex + 1;
      }
    }
    else {
      group._4_2_ = cVar1 + L'￐';
      if (9 < group._4_2_) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x317,"(captureIndex < 10)","captureIndex < 10");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      substitutionOffset = startIndex + 2;
      if (((substitutionOffset < cVar6) && (cVar1 = pcVar9[startIndex + 2], 0x2f < (ushort)cVar1))
         && ((ushort)cVar1 < 0x3a)) {
        uVar4 = group._4_2_ * 10 + cVar1 + L'￐';
        if (99 < uVar4) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                      ,0x321,"(tempCaptureIndex < 100)","tempCaptureIndex < 100");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar10 = 0;
        }
        if ((int)(uint)uVar4 < numGroups) {
          substitutionOffset = startIndex + 3;
          group._4_2_ = uVar4;
        }
      }
      if (99 < group._4_2_) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                    ,0x32a,"(captureIndex < 100)","captureIndex < 100");
        if (!bVar3) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar10 = 0;
      }
      if (((int)(uint)group._4_2_ < numGroups) && (group._4_2_ != 0)) {
        aValue = RegexEs5ReplaceImpl::anon_class_24_3_dc2687f5::operator()
                           (&getGroup,(uint)group._4_2_,nonMatchValue_00);
        bVar3 = VarIs<Js::JavascriptString>(aValue);
        if (bVar3) {
          s = UnsafeVarTo<Js::JavascriptString>(aValue);
          CompoundString::Builder<256U>::Append(concatenated,s);
        }
        else if (aValue != nonMatchValue_00) {
          CompoundString::Builder<256U>::Append
                    (concatenated,replace,startIndex,substitutionOffset - startIndex);
        }
      }
      else {
        CompoundString::Builder<256U>::Append
                  (concatenated,replace,startIndex,substitutionOffset - startIndex);
      }
    }
    _captureIndex = _captureIndex + 1;
  } while( true );
}

Assistant:

void RegexHelper::ReplaceFormatString
        ( ScriptContext* scriptContext
        , int numGroups
        , GroupFn getGroup
        , JavascriptString* input
        , const char16* matchedString
        , UnifiedRegex::GroupInfo match
        , JavascriptString* replace
        , int substitutions
        , __in_ecount(substitutions) CharCount* substitutionOffsets
        , CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)>& concatenated )
    {
        Var nonMatchValue = NonMatchValue(scriptContext, false);
        const CharCount inputLength = input->GetLength();
        const char16* replaceStr = replace->GetString();
        const CharCount replaceLength = replace->GetLength();

        CharCount offset = 0;
        for (int i = 0; i < substitutions; i++)
        {
            CharCount substitutionOffset = substitutionOffsets[i];
            concatenated.Append(replace, offset, substitutionOffset - offset);
            char16 currentChar = replaceStr[substitutionOffset + 1];
            if (currentChar >= _u('0') && currentChar <= _u('9'))
            {
                // We've found a substitution ref, like $32.  In accordance with the standard (sec-getsubstitution),
                // we recognize at most two decimal digits after the dollar sign.
                uint16 captureIndex = (uint16)(currentChar - _u('0'));
                Assert(captureIndex < 10); // numeric value of single decimal digit

                offset = substitutionOffset + 2;

                if (offset < replaceLength)
                {
                    currentChar = replaceStr[substitutionOffset + 2];
                    if (currentChar >= _u('0') && currentChar <= _u('9'))
                    {
                        uint16 tempCaptureIndex = (10 * captureIndex) + (uint16)(currentChar - _u('0'));
                        Assert(tempCaptureIndex < 100); // numeric value of 2-digit positive decimal number
                        if (tempCaptureIndex < numGroups)
                        {
                            captureIndex = tempCaptureIndex;
                            offset = substitutionOffset + 3;
                        }
                    }
                }

                Assert(captureIndex < 100); // as above, value of 2-digit positive decimal number
                if (captureIndex < numGroups && (captureIndex != 0))
                {
                    Var group = getGroup(captureIndex, nonMatchValue);
                    if (VarIs<JavascriptString>(group))
                        concatenated.Append(UnsafeVarTo<JavascriptString>(group));
                    else if (group != nonMatchValue)
                        concatenated.Append(replace, substitutionOffset, offset - substitutionOffset);
                }
                else
                    concatenated.Append(replace, substitutionOffset, offset - substitutionOffset);
            }
            else
            {
                switch (currentChar)
                {
                case _u('$'): // literal '$' character
                    concatenated.Append(_u('$'));
                    offset = substitutionOffset + 2;
                    break;
                case _u('&'): // matched string
                    concatenated.Append(matchedString, match.length);
                    offset = substitutionOffset + 2;
                    break;
                case _u('`'): // left context
                    concatenated.Append(input, 0, match.offset);
                    offset = substitutionOffset + 2;
                    break;
                case _u('\''): // right context
                    if (match.EndOffset() < inputLength)
                    {
                        concatenated.Append(input, match.EndOffset(), inputLength - match.EndOffset());
                    }
                    offset = substitutionOffset + 2;
                    break;
                default:
                    concatenated.Append(_u('$'));
                    offset = substitutionOffset + 1;
                    break;
                }
            }
        }
        concatenated.Append(replace, offset, replaceLength - offset);
    }